

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  undefined8 this_01;
  undefined8 uVar1;
  bool bVar2;
  cmListFileLexer_Token *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ostream *poVar6;
  Delimiter delim;
  anon_enum_32 aVar7;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  ostringstream error;
  undefined1 auStack_2c8 [8];
  long local_2c0;
  undefined1 local_2b8 [64];
  undefined1 local_278;
  undefined7 uStack_277;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  long local_248;
  void **local_240;
  void *local_230 [2];
  char local_220;
  undefined1 local_218 [376];
  cmListFileContext local_a0;
  
  pcVar5 = (char *)(this->FunctionName)._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&this->FunctionName,0,pcVar5,(ulong)name);
  this->FunctionLine = line;
  do {
    pcVar3 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar3 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Unexpected end of file.\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      IssueError(this,(string *)(local_2b8 + 0x30));
      goto LAB_003bc14c;
    }
  } while (pcVar3->type == cmListFileLexer_Token_Space);
  if (pcVar3->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    pcVar3 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar3 != (cmListFileLexer_Token *)0x0) {
      local_2c0 = 0;
      do {
        if (pcVar3->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_003bbe50;
        }
        switch(pcVar3->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          aVar7 = SeparationWarning;
          if (!bVar2) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          if (!bVar2) {
            return false;
          }
          local_2c0 = local_2c0 + 1;
          goto LAB_003bbe50;
        case cmListFileLexer_Token_ParenRight:
          if (local_2c0 == 0) {
            this->FunctionLineEnd = (long)pcVar3->line;
            return true;
          }
          this->Separation = SeparationOkay;
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          if (!bVar2) {
            return false;
          }
          local_2c0 = local_2c0 + -1;
          aVar7 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar7 = SeparationWarning;
          delim = Quoted;
          goto LAB_003bbf29;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar7 = SeparationError;
          delim = Bracket;
LAB_003bbf29:
          bVar2 = AddArgument(this,pcVar3,delim);
          if (!bVar2) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar7 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Instead found ",0xe);
          pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          poVar6 = std::operator<<((ostream *)local_218,pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," with text \"",0xc);
          poVar6 = std::operator<<(poVar6,pcVar3->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,(string *)(local_2b8 + 0x30));
          goto LAB_003bc14c;
        }
        this->Separation = aVar7;
LAB_003bbe50:
        pcVar3 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar3 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    local_2b8._56_8_ = 0;
    local_278 = 0;
    local_268._8_8_ = 0;
    local_258._M_local_buf[0] = '\0';
    local_248 = 0;
    local_220 = '\0';
    pcVar5 = this->FileName;
    local_2b8._48_8_ = local_2b8 + 0x40;
    local_268._0_8_ = &local_258;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)(local_2b8 + 0x50),0,(char *)0x0,(ulong)pcVar5);
    local_2b8._0_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_2b8._8_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_)->_M_use_count + 1;
      }
    }
    local_248 = line;
    cmListFileContext::cmListFileContext(&local_a0,(cmListFileContext *)(local_2b8 + 0x30));
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_2b8 + 0x10),
               (cmListFileContext *)local_2b8);
    uVar1 = local_2b8._24_8_;
    local_2b8._0_8_ = local_2b8._16_8_;
    this_01 = local_2b8._8_8_;
    local_2b8._16_8_ = (pointer)0x0;
    local_2b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2b8._8_8_ = uVar1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._24_8_);
    }
    if ((local_a0.DeferId.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_a0.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_a0.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_a0.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_a0.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
      operator_delete(local_a0.FilePath._M_dataplus._M_p,
                      local_a0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
      operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"End of file reached.",0x14);
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage
              (this_00,FATAL_ERROR,(string *)(local_2b8 + 0x10),(cmListFileBacktrace *)local_2b8);
    if ((undefined1 *)local_2b8._16_8_ != local_2b8 + 0x20) {
      operator_delete((void *)local_2b8._16_8_,(ulong)(local_2b8._32_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
    }
    if ((local_220 == '\x01') && (local_220 = '\0', local_240 != local_230)) {
      operator_delete(local_240,(long)local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != &local_258) {
      operator_delete((void *)local_268._0_8_,
                      CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_2b8._48_8_ == local_2b8 + 0x40) goto LAB_003bc167;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Parse error.  Expected \"(\", got ",0x20);
    pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_218._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," with text \"",0xc);
    pcVar5 = pcVar3->text;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_218._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueError(this,(string *)(local_2b8 + 0x30));
LAB_003bc14c:
    if ((undefined1 *)local_2b8._48_8_ == local_2b8 + 0x40) goto LAB_003bc167;
  }
  operator_delete((void *)local_2b8._48_8_,CONCAT71(uStack_277,local_278) + 1);
LAB_003bc167:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->FunctionName = name;
  this->FunctionLine = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->FunctionLineEnd = token->line;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}